

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

pcut_item_t * pcut_find_by_id(pcut_item_t *first,int id)

{
  pcut_item_t *local_28;
  pcut_item_t *it;
  int id_local;
  pcut_item_t *first_local;
  
  local_28 = pcut_get_real(first);
  while( true ) {
    if (local_28 == (pcut_item_t *)0x0) {
      return (pcut_item_t *)0x0;
    }
    if (local_28->id == id) break;
    local_28 = pcut_get_real_next(local_28);
  }
  return local_28;
}

Assistant:

static pcut_item_t *pcut_find_by_id(pcut_item_t *first, int id) {
	pcut_item_t *it = pcut_get_real(first);
	while (it != NULL) {
		if (it->id == id) {
			return it;
		}
		it = pcut_get_real_next(it);
	}
	return NULL;
}